

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ConsoleReporter::AssertionPrinter::AssertionPrinter
          (AssertionPrinter *this,ostream *_stream,AssertionStats *_stats,bool _printInfoMessages)

{
  string *psVar1;
  string *psVar2;
  OfType OVar3;
  Code CVar4;
  long lVar5;
  
  this->stream = _stream;
  this->stats = _stats;
  this->result = &_stats->assertionResult;
  this->colour = None;
  (this->passOrFail)._M_dataplus._M_p = (pointer)&(this->passOrFail).field_2;
  (this->passOrFail)._M_string_length = 0;
  psVar1 = &this->passOrFail;
  (this->passOrFail).field_2._M_local_buf[0] = '\0';
  (this->messageLabel)._M_dataplus._M_p = (pointer)&(this->messageLabel).field_2;
  (this->messageLabel)._M_string_length = 0;
  psVar2 = &this->messageLabel;
  (this->messageLabel).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string
            ((string *)&this->message,(string *)&(_stats->assertionResult).m_resultData.message);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&this->messages,&_stats->infoMessages);
  this->printInfoMessages = _printInfoMessages;
  OVar3 = (this->result->m_resultData).resultType;
  switch(OVar3) {
  case Ok:
    this->colour = Green;
    std::__cxx11::string::assign((char *)psVar1);
    lVar5 = (long)(_stats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(_stats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (lVar5 == 0x78) {
      std::__cxx11::string::assign((char *)psVar2);
LAB_0015f283:
      lVar5 = (long)(_stats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(_stats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start;
    }
    break;
  case Info:
    goto LAB_0015f2a6;
  case Warning:
    goto LAB_0015f2a6;
  case Unknown:
switchD_0015f116_caseD_0:
    std::__cxx11::string::assign((char *)psVar1);
    this->colour = BrightRed;
    return;
  default:
    if (OVar3 == FailureBit) goto switchD_0015f116_caseD_0;
    if (OVar3 == ExpressionFailed) {
      CVar4 = Green;
      if (((this->result->m_info).resultDisposition & SuppressFail) == 0) {
        CVar4 = BrightRed;
      }
      this->colour = CVar4;
      std::__cxx11::string::assign((char *)psVar1);
      lVar5 = (long)(_stats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(_stats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      if (lVar5 == 0x78) {
        std::__cxx11::string::assign((char *)psVar2);
        goto LAB_0015f283;
      }
    }
    else {
      if (OVar3 != ExplicitFailure) {
        if (OVar3 != Exception) {
          if (OVar3 == ThrewException) {
            this->colour = BrightRed;
            std::__cxx11::string::assign((char *)psVar1);
          }
          else if (OVar3 == DidntThrowException) {
            this->colour = BrightRed;
            std::__cxx11::string::assign((char *)psVar1);
          }
          else {
            if (OVar3 != FatalErrorCondition) {
              return;
            }
            this->colour = BrightRed;
            std::__cxx11::string::assign((char *)psVar1);
          }
          goto LAB_0015f2a6;
        }
        goto switchD_0015f116_caseD_0;
      }
      std::__cxx11::string::assign((char *)psVar1);
      this->colour = BrightRed;
      lVar5 = (long)(_stats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(_stats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      if (lVar5 == 0x78) {
        std::__cxx11::string::assign((char *)psVar2);
        lVar5 = (long)(_stats->infoMessages).
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(_stats->infoMessages).
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_start;
      }
    }
  }
  if ((ulong)(lVar5 / 0x78) < 2) {
    return;
  }
LAB_0015f2a6:
  std::__cxx11::string::assign((char *)psVar2);
  return;
}

Assistant:

AssertionPrinter( std::ostream& _stream, AssertionStats const& _stats, bool _printInfoMessages )
            :   stream( _stream ),
                stats( _stats ),
                result( _stats.assertionResult ),
                colour( Colour::None ),
                message( result.getMessage() ),
                messages( _stats.infoMessages ),
                printInfoMessages( _printInfoMessages )
            {
                switch( result.getResultType() ) {
                    case ResultWas::Ok:
                        colour = Colour::Success;
                        passOrFail = "PASSED";
                        //if( result.hasMessage() )
                        if( _stats.infoMessages.size() == 1 )
                            messageLabel = "with message";
                        if( _stats.infoMessages.size() > 1 )
                            messageLabel = "with messages";
                        break;
                    case ResultWas::ExpressionFailed:
                        if( result.isOk() ) {
                            colour = Colour::Success;
                            passOrFail = "FAILED - but was ok";
                        }
                        else {
                            colour = Colour::Error;
                            passOrFail = "FAILED";
                        }
                        if( _stats.infoMessages.size() == 1 )
                            messageLabel = "with message";
                        if( _stats.infoMessages.size() > 1 )
                            messageLabel = "with messages";
                        break;
                    case ResultWas::ThrewException:
                        colour = Colour::Error;
                        passOrFail = "FAILED";
                        messageLabel = "due to unexpected exception with message";
                        break;
                    case ResultWas::FatalErrorCondition:
                        colour = Colour::Error;
                        passOrFail = "FAILED";
                        messageLabel = "due to a fatal error condition";
                        break;
                    case ResultWas::DidntThrowException:
                        colour = Colour::Error;
                        passOrFail = "FAILED";
                        messageLabel = "because no exception was thrown where one was expected";
                        break;
                    case ResultWas::Info:
                        messageLabel = "info";
                        break;
                    case ResultWas::Warning:
                        messageLabel = "warning";
                        break;
                    case ResultWas::ExplicitFailure:
                        passOrFail = "FAILED";
                        colour = Colour::Error;
                        if( _stats.infoMessages.size() == 1 )
                            messageLabel = "explicitly with message";
                        if( _stats.infoMessages.size() > 1 )
                            messageLabel = "explicitly with messages";
                        break;
                    // These cases are here to prevent compiler warnings
                    case ResultWas::Unknown:
                    case ResultWas::FailureBit:
                    case ResultWas::Exception:
                        passOrFail = "** internal error **";
                        colour = Colour::Error;
                        break;
                }
            }